

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

int BZ2_bzDecompressEnd(bz_stream *strm)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = -2;
  if (((strm != (bz_stream *)0x0) &&
      (plVar1 = (long *)strm->state, iVar2 = -2, plVar1 != (long *)0x0)) &&
     ((bz_stream *)*plVar1 == strm)) {
    if ((void *)plVar1[0x18a] != (void *)0x0) {
      (*strm->bzfree)(strm->opaque,(void *)plVar1[0x18a]);
    }
    if ((void *)plVar1[0x18b] != (void *)0x0) {
      (*strm->bzfree)(strm->opaque,(void *)plVar1[0x18b]);
    }
    if ((void *)plVar1[0x18c] != (void *)0x0) {
      (*strm->bzfree)(strm->opaque,(void *)plVar1[0x18c]);
    }
    (*strm->bzfree)(strm->opaque,strm->state);
    strm->state = (void *)0x0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int BZ_API(BZ2_bzDecompressEnd)  ( bz_stream *strm )
{
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   if (s->tt   != NULL) BZFREE(s->tt);
   if (s->ll16 != NULL) BZFREE(s->ll16);
   if (s->ll4  != NULL) BZFREE(s->ll4);

   BZFREE(strm->state);
   strm->state = NULL;

   return BZ_OK;
}